

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::GetActualResultType
          (ValidationState_t *_,Instruction *inst,uint32_t *actual_result_type)

{
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  DiagnosticStream *pDVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type sVar6;
  DiagnosticStream local_3e8;
  DiagnosticStream local_210;
  Instruction *local_38;
  Instruction *type_inst;
  uint32_t *puStack_28;
  Op opcode;
  uint32_t *actual_result_type_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  puStack_28 = actual_result_type;
  actual_result_type_local = (uint32_t *)inst;
  inst_local = (Instruction *)_;
  type_inst._4_4_ = val::Instruction::opcode(inst);
  bVar2 = IsSparse(type_inst._4_4_);
  pIVar1 = inst_local;
  if (!bVar2) {
    uVar4 = val::Instruction::type_id((Instruction *)actual_result_type_local);
    *puStack_28 = uVar4;
    return SPV_SUCCESS;
  }
  uVar4 = val::Instruction::type_id((Instruction *)actual_result_type_local);
  local_38 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar4);
  if (local_38 != (Instruction *)0x0) {
    if ((local_38 != (Instruction *)0x0) &&
       (OVar3 = val::Instruction::opcode(local_38), OVar3 == OpTypeStruct)) {
      this = val::Instruction::words(local_38);
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
      pIVar1 = inst_local;
      if (sVar6 == 4) {
        uVar4 = val::Instruction::word(local_38,2);
        bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)pIVar1,uVar4);
        if (bVar2) {
          uVar4 = val::Instruction::word(local_38,3);
          *puStack_28 = uVar4;
          return SPV_SUCCESS;
        }
      }
      ValidationState_t::diag
                (&local_3e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)actual_result_type_local);
      pDVar5 = DiagnosticStream::operator<<
                         (&local_3e8,
                          (char (*) [73])
                          "Expected Result Type to be a struct containing an int scalar and a texel"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream(&local_3e8);
      return __local._4_4_;
    }
    ValidationState_t::diag
              (&local_210,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               (Instruction *)actual_result_type_local);
    pDVar5 = DiagnosticStream::operator<<
                       (&local_210,(char (*) [40])"Expected Result Type to be OpTypeStruct");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    DiagnosticStream::~DiagnosticStream(&local_210);
    return __local._4_4_;
  }
  __assert_fail("type_inst",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                ,0x2e9,
                "spv_result_t spvtools::val::(anonymous namespace)::GetActualResultType(ValidationState_t &, const Instruction *, uint32_t *)"
               );
}

Assistant:

spv_result_t GetActualResultType(ValidationState_t& _, const Instruction* inst,
                                 uint32_t* actual_result_type) {
  const spv::Op opcode = inst->opcode();

  if (IsSparse(opcode)) {
    const Instruction* const type_inst = _.FindDef(inst->type_id());
    assert(type_inst);

    if (!type_inst || type_inst->opcode() != spv::Op::OpTypeStruct) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Result Type to be OpTypeStruct";
    }

    if (type_inst->words().size() != 4 ||
        !_.IsIntScalarType(type_inst->word(2))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Result Type to be a struct containing an int "
                "scalar and a texel";
    }

    *actual_result_type = type_inst->word(3);
  } else {
    *actual_result_type = inst->type_id();
  }

  return SPV_SUCCESS;
}